

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  int iVar1;
  int in_EDX;
  long *in_RDI;
  int ii_1;
  char *z_1;
  int ii;
  char *z;
  i64 iVal;
  int eType;
  int eDetail;
  Fts5VocabCursor *pCsr;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar2;
  long local_30;
  
  iVar1 = *(int *)(*(long *)(in_RDI[2] + 0x18) + 0x74);
  local_30 = 0;
  if (in_EDX == 0) {
    sqlite3_result_text((sqlite3_context *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                        (_func_void_void_ptr *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else if (*(int *)(*in_RDI + 0x38) == 0) {
    if (in_EDX == 1) {
      if (iVar1 != 1) {
        sqlite3_result_text((sqlite3_context *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                            (_func_void_void_ptr *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
    }
    else if (in_EDX == 2) {
      local_30 = *(long *)(in_RDI[10] + (long)*(int *)((long)in_RDI + 0x44) * 8);
    }
    else {
      local_30 = *(long *)(in_RDI[9] + (long)*(int *)((long)in_RDI + 0x44) * 8);
    }
  }
  else if (*(int *)(*in_RDI + 0x38) == 1) {
    if (in_EDX == 1) {
      local_30 = *(long *)in_RDI[10];
    }
    else {
      local_30 = *(long *)in_RDI[9];
    }
  }
  else if (in_EDX == 1) {
    sqlite3_result_int64
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffb4,1),
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffffb0 = in_EDX;
  }
  else {
    in_stack_ffffffffffffffb0 = in_EDX;
    if (in_EDX == 2) {
      uVar2 = 0xffffffff;
      if (iVar1 == 0) {
        uVar2 = (uint)((ulong)in_RDI[0xe] >> 0x20) & 0x7fffffff;
      }
      else if (iVar1 == 2) {
        uVar2 = (uint)in_RDI[0xe];
      }
      if ((-1 < (int)uVar2) && ((int)uVar2 < *(int *)(*(long *)(in_RDI[2] + 0x18) + 0x20))) {
        sqlite3_result_text((sqlite3_context *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                            *(char **)(*(long *)(*(long *)(in_RDI[2] + 0x18) + 0x28) +
                                      (long)(int)uVar2 * 8),in_stack_ffffffffffffffb4,
                            (_func_void_void_ptr *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        in_stack_ffffffffffffffb0 = in_EDX;
      }
    }
    else if (iVar1 == 0) {
      in_stack_ffffffffffffffb4 = (uint)in_RDI[0xe] & 0x7fffffff;
      sqlite3_result_int((sqlite3_context *)
                         (CONCAT44((uint)in_RDI[0xe],in_EDX) & 0x7fffffffffffffff),
                         in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffb0 = in_EDX;
    }
  }
  if (0 < local_30) {
    sqlite3_result_int64
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return 0;
}

Assistant:

static int fts5VocabColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eDetail = pCsr->pFts5->pConfig->eDetail;
  int eType = ((Fts5VocabTable*)(pCursor->pVtab))->eType;
  i64 iVal = 0;

  if( iCol==0 ){
    sqlite3_result_text(
        pCtx, (const char*)pCsr->term.p, pCsr->term.n, SQLITE_TRANSIENT
    );
  }else if( eType==FTS5_VOCAB_COL ){
    assert( iCol==1 || iCol==2 || iCol==3 );
    if( iCol==1 ){
      if( eDetail!=FTS5_DETAIL_NONE ){
        const char *z = pCsr->pFts5->pConfig->azCol[pCsr->iCol];
        sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
      }
    }else if( iCol==2 ){
      iVal = pCsr->aDoc[pCsr->iCol];
    }else{
      iVal = pCsr->aCnt[pCsr->iCol];
    }
  }else if( eType==FTS5_VOCAB_ROW ){
    assert( iCol==1 || iCol==2 );
    if( iCol==1 ){
      iVal = pCsr->aDoc[0];
    }else{
      iVal = pCsr->aCnt[0];
    }
  }else{
    assert( eType==FTS5_VOCAB_INSTANCE );
    switch( iCol ){
      case 1:
        sqlite3_result_int64(pCtx, pCsr->pIter->iRowid);
        break;
      case 2: {
        int ii = -1;
        if( eDetail==FTS5_DETAIL_FULL ){
          ii = FTS5_POS2COLUMN(pCsr->iInstPos);
        }else if( eDetail==FTS5_DETAIL_COLUMNS ){
          ii = (int)pCsr->iInstPos;
        }
        if( ii>=0 && ii<pCsr->pFts5->pConfig->nCol ){
          const char *z = pCsr->pFts5->pConfig->azCol[ii];
          sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
        }
        break;
      }
      default: {
        assert( iCol==3 );
        if( eDetail==FTS5_DETAIL_FULL ){
          int ii = FTS5_POS2OFFSET(pCsr->iInstPos);
          sqlite3_result_int(pCtx, ii);
        }
        break;
      }
    }
  }

  if( iVal>0 ) sqlite3_result_int64(pCtx, iVal);
  return SQLITE_OK;
}